

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

void __thiscall
FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
          (FillableSigningProvider *this,CPubKey *pubkey)

{
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  long in_FS_OFFSET;
  CScriptID id;
  CScript script;
  CKeyID key_id;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_a8;
  undefined1 local_60;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_50;
  CKeyID local_2c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::GetID(&local_2c,pubkey);
  if ((pubkey->vch[0] & 0xfe) == 2) {
    local_a8._M_first._M_storage._M_storage[0x10] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10];
    local_a8._M_first._M_storage._M_storage[0x11] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11];
    local_a8._M_first._M_storage._M_storage[0x12] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12];
    local_a8._M_first._M_storage._M_storage[0x13] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13];
    local_a8._M_first._M_storage._M_storage[0] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
    local_a8._M_first._M_storage._M_storage[1] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
    local_a8._M_first._M_storage._M_storage[2] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
    local_a8._M_first._M_storage._M_storage[3] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
    local_a8._M_first._M_storage._M_storage[4] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[4];
    local_a8._M_first._M_storage._M_storage[5] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[5];
    local_a8._M_first._M_storage._M_storage[6] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[6];
    local_a8._M_first._M_storage._M_storage[7] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[7];
    local_a8._M_first._M_storage._M_storage[8] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[8];
    local_a8._M_first._M_storage._M_storage[9] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[9];
    local_a8._M_first._M_storage._M_storage[10] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[10];
    local_a8._M_first._M_storage._M_storage[0xb] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb];
    local_a8._M_first._M_storage._M_storage[0xc] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc];
    local_a8._M_first._M_storage._M_storage[0xd] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd];
    local_a8._M_first._M_storage._M_storage[0xe] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe];
    local_a8._M_first._M_storage._M_storage[0xf] =
         local_2c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf];
    local_60 = 5;
    GetScriptForDestination((CScript *)&local_50,(CTxDestination *)&local_a8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_a8._M_first);
    CScriptID::CScriptID((CScriptID *)&local_a8._M_first,(CScript *)&local_50);
    this_00 = &std::
               map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               ::operator[](&this->mapScripts,(key_type *)&local_a8._M_first)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(this_00,&local_50);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts(const CPubKey& pubkey)
{
    AssertLockHeld(cs_KeyStore);
    CKeyID key_id = pubkey.GetID();
    // This adds the redeemscripts necessary to detect P2WPKH and P2SH-P2WPKH
    // outputs. Technically P2WPKH outputs don't have a redeemscript to be
    // spent. However, our current IsMine logic requires the corresponding
    // P2SH-P2WPKH redeemscript to be present in the wallet in order to accept
    // payment even to P2WPKH outputs.
    // Also note that having superfluous scripts in the keystore never hurts.
    // They're only used to guide recursion in signing and IsMine logic - if
    // a script is present but we can't do anything with it, it has no effect.
    // "Implicitly" refers to fact that scripts are derived automatically from
    // existing keys, and are present in memory, even without being explicitly
    // loaded (e.g. from a file).
    if (pubkey.IsCompressed()) {
        CScript script = GetScriptForDestination(WitnessV0KeyHash(key_id));
        // This does not use AddCScript, as it may be overridden.
        CScriptID id(script);
        mapScripts[id] = std::move(script);
    }
}